

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# astar.cpp
# Opt level: O1

void __thiscall indigox::algorithm::AStarOptimisation::Initalise(AStarOptimisation *this)

{
  pointer *pppvVar1;
  void **__args;
  pointer puVar2;
  pointer ppvVar3;
  ElectronOpt *pEVar4;
  pointer __s;
  pointer puVar5;
  element_type *peVar6;
  undefined8 *puVar7;
  iterator __position;
  AStarQueueItem *__p;
  AdjList *g;
  _List_iterator<void_*> v;
  size_t count;
  p_AStarQueueItem init;
  unsigned_long local_98;
  vector<void*,std::allocator<void*>> *local_90;
  p_AStarQueueItem local_88;
  PriorityQueue *local_78;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> local_70;
  ElnDist local_50;
  
  puVar2 = (this->uniqueIDs_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((this->uniqueIDs_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish != puVar2) {
    (this->uniqueIDs_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar2;
  }
  std::
  vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::_M_erase_at_end(&this->requiredUnchangeables_,
                    (this->requiredUnchangeables_).
                    super__Vector_base<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  std::
  _Rb_tree<std::pair<void_*,_void_*>,_std::pair<const_std::pair<void_*,_void_*>,_void_*>,_std::_Select1st<std::pair<const_std::pair<void_*,_void_*>,_void_*>_>,_std::less<std::pair<void_*,_void_*>_>,_std::allocator<std::pair<const_std::pair<void_*,_void_*>,_void_*>_>_>
  ::clear(&(this->idsToVertex_)._M_t);
  std::
  vector<std::pair<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_unsigned_int>,_std::allocator<std::pair<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_unsigned_int>_>_>
  ::_M_erase_at_end(&(this->super_ElectronOptimisationAlgorithm).minDistributions_,
                    (this->super_ElectronOptimisationAlgorithm).minDistributions_.
                    super__Vector_base<std::pair<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_unsigned_int>,_std::allocator<std::pair<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_unsigned_int>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  std::
  _Rb_tree<void_*,_std::pair<void_*const,_indigox::ElnVertProp_*>,_std::_Select1st<std::pair<void_*const,_indigox::ElnVertProp_*>_>,_std::less<void_*>,_std::allocator<std::pair<void_*const,_indigox::ElnVertProp_*>_>_>
  ::clear(&(this->vertexProperties_)._M_t);
  ppvVar3 = (this->pos2vert_).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((this->pos2vert_).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppvVar3) {
    (this->pos2vert_).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppvVar3;
  }
  std::
  _Rb_tree<void_*,_std::pair<void_*const,_unsigned_long>,_std::_Select1st<std::pair<void_*const,_unsigned_long>_>,_std::less<void_*>,_std::allocator<std::pair<void_*const,_unsigned_long>_>_>
  ::clear(&(this->vert2pos_)._M_t);
  local_78 = &this->queue_;
  std::
  vector<std::shared_ptr<indigox::algorithm::AStarQueueItem>,_std::allocator<std::shared_ptr<indigox::algorithm::AStarQueueItem>_>_>
  ::clear((vector<std::shared_ptr<indigox::algorithm::AStarQueueItem>,_std::allocator<std::shared_ptr<indigox::algorithm::AStarQueueItem>_>_>
           *)local_78);
  utils::Graph<indigox::MolVertProp,_indigox::MolEdgeProp,_indigox::utils::UndirectedGraph>::
  ResetIndicies(&((((this->super_ElectronOptimisationAlgorithm).parent_)->molGraph_).
                  super___shared_ptr<indigox::MolecularGraph,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                 super__MolGraph);
  pEVar4 = (this->super_ElectronOptimisationAlgorithm).parent_;
  this->vertMaskSize_ =
       *(size_t *)
        ((long)&((((pEVar4->elnGraph_).
                   super___shared_ptr<indigox::ElectronGraph,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                 super__ElnGraph).graph_.
                 super___shared_ptr<boost::adjacency_list<boost::setS,_boost::listS,_boost::undirectedS,_indigox::ElnVertProp,_indigox::utils::NoProperty,_boost::no_property,_boost::listS>,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr)->super_type + 0x28);
  boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::dynamic_bitset
            (&local_70,
             (long)(pEVar4->possibleLocations_).
                   super__Vector_base<std::pair<void_*,_void_*>,_std::allocator<std::pair<void_*,_void_*>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(pEVar4->possibleLocations_).
                   super__Vector_base<std::pair<void_*,_void_*>,_std::allocator<std::pair<void_*,_void_*>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 4,0,
             (allocator<unsigned_long> *)&local_98);
  if (&local_70 != &(this->super_ElectronOptimisationAlgorithm).previousDist_) {
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_move_assign();
    (this->super_ElectronOptimisationAlgorithm).previousDist_.m_num_bits = local_70.m_num_bits;
    local_70.m_num_bits = 0;
  }
  if (local_70.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_70.m_bits.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_70.m_bits.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_70.m_bits.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  local_90 = (vector<void*,std::allocator<void*>> *)&this->pos2vert_;
  __s = (this->super_ElectronOptimisationAlgorithm).previousDist_.m_bits.
        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start;
  puVar5 = (this->super_ElectronOptimisationAlgorithm).previousDist_.m_bits.
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (__s != puVar5) {
    memset(__s,0,(long)puVar5 - (long)__s & 0xfffffffffffffff8);
  }
  std::vector<void_*,_std::allocator<void_*>_>::reserve
            ((vector<void_*,_std::allocator<void_*>_> *)local_90,this->vertMaskSize_);
  peVar6 = (((((this->super_ElectronOptimisationAlgorithm).parent_)->elnGraph_).
             super___shared_ptr<indigox::ElectronGraph,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
           super__ElnGraph).graph_.
           super___shared_ptr<boost::adjacency_list<boost::setS,_boost::listS,_boost::undirectedS,_indigox::ElnVertProp,_indigox::utils::NoProperty,_boost::no_property,_boost::listS>,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  puVar7 = *(undefined8 **)
            &((StoredVertexList *)((long)&peVar6->super_type + 0x18))->
             super__List_base<void_*,_std::allocator<void_*>_>;
  local_98 = 0;
  for (; (StoredVertexList *)puVar7 != (StoredVertexList *)((long)&peVar6->super_type + 0x18U);
      puVar7 = (undefined8 *)*puVar7) {
    __args = (void **)(puVar7 + 2);
    __position._M_current =
         (this->pos2vert_).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this->pos2vert_).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<void*,std::allocator<void*>>::_M_realloc_insert<void*const&>
                (local_90,__position,__args);
    }
    else {
      *__position._M_current = *__args;
      pppvVar1 = &(this->pos2vert_).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                  super__Vector_impl_data._M_finish;
      *pppvVar1 = *pppvVar1 + 1;
    }
    std::
    _Rb_tree<void*,std::pair<void*const,unsigned_long>,std::_Select1st<std::pair<void*const,unsigned_long>>,std::less<void*>,std::allocator<std::pair<void*const,unsigned_long>>>
    ::_M_emplace_unique<void*&,unsigned_long&>
              ((_Rb_tree<void*,std::pair<void*const,unsigned_long>,std::_Select1st<std::pair<void*const,unsigned_long>>,std::less<void*>,std::allocator<std::pair<void*const,unsigned_long>>>
                *)&this->vert2pos_,__args,&local_98);
    local_98 = local_98 + 1;
  }
  PopulateUniqueIDs(this);
  PopulateUnchangeables(this);
  __p = (AStarQueueItem *)operator_new(0x90);
  memset(__p,0,0x90);
  local_70.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)__p;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<indigox::algorithm::AStarQueueItem*>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_70.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
              _M_impl.super__Vector_impl_data._M_finish,__p);
  local_88.super___shared_ptr<indigox::algorithm::AStarQueueItem,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)
         local_70.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
         super__Vector_impl_data._M_start;
  local_88.super___shared_ptr<indigox::algorithm::AStarQueueItem,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
       local_70.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      local_70.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(_Atomic_word *)
       ((long)local_70.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
              _M_impl.super__Vector_impl_data._M_finish + 8) =
           *(_Atomic_word *)
            ((long)local_70.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                   ._M_impl.super__Vector_impl_data._M_finish + 8) + 1;
      UNLOCK();
    }
    else {
      *(_Atomic_word *)
       ((long)local_70.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
              _M_impl.super__Vector_impl_data._M_finish + 8) =
           *(_Atomic_word *)
            ((long)local_70.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                   ._M_impl.super__Vector_impl_data._M_finish + 8) + 1;
    }
  }
  PopulateInitialDistribution(this,&local_88);
  if (local_88.super___shared_ptr<indigox::algorithm::AStarQueueItem,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_88.
               super___shared_ptr<indigox::algorithm::AStarQueueItem,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  std::
  priority_queue<std::shared_ptr<indigox::algorithm::AStarQueueItem>,_std::vector<std::shared_ptr<indigox::algorithm::AStarQueueItem>,_std::allocator<std::shared_ptr<indigox::algorithm::AStarQueueItem>_>_>,_indigox::algorithm::ItemCompare>
  ::push(&local_78->
          super_priority_queue<std::shared_ptr<indigox::algorithm::AStarQueueItem>,_std::vector<std::shared_ptr<indigox::algorithm::AStarQueueItem>,_std::allocator<std::shared_ptr<indigox::algorithm::AStarQueueItem>_>_>,_indigox::algorithm::ItemCompare>
         ,(value_type *)&local_70);
  ElectronOptimisationAlgorithm::CalculateUpperLimit
            (&local_50,&this->super_ElectronOptimisationAlgorithm);
  if (local_50.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_50.m_bits.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_50.m_bits.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_50.m_bits.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      local_70.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_70.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
               _M_impl.super__Vector_impl_data._M_finish);
  }
  return;
}

Assistant:

void AStarOptimisation::Initalise() {
  uniqueIDs_.clear();
  requiredUnchangeables_.clear();
  idsToVertex_.clear();
  minDistributions_.clear();
  vertexProperties_.clear();
  pos2vert_.clear();
  vert2pos_.clear();
  queue_.clear();
  parent_->molGraph_->ResetIndicies();
  
  vertMaskSize_ = parent_->elnGraph_->NumVertices();
  
  previousDist_ = ElnDist(parent_->possibleLocations_.size());
  previousDist_.reset();
  pos2vert_.reserve(vertMaskSize_);
  ElnVertIterPair vs = parent_->elnGraph_->GetVertices();
  size_t count = 0;
  for (auto v = vs.first; v != vs.second; ++v) {
    pos2vert_.push_back(*v);
    vert2pos_.emplace(*v, count);
    ++count;
  }
  
  PopulateUniqueIDs();
  PopulateUnchangeables();
  p_AStarQueueItem init = p_AStarQueueItem(new AStarQueueItem());
  PopulateInitialDistribution(init);
  queue_.push(init);
  CalculateUpperLimit();
}